

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibraryBase::Dispose(JavascriptLibraryBase *this,bool isShutdown)

{
  ScriptContext *pSVar1;
  ScriptContext *local_28;
  
  pSVar1 = (this->scriptContext).ptr;
  if (pSVar1 != (ScriptContext *)0x0) {
    Memory::Recycler::WBSetBit((char *)&local_28);
    local_28 = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
    pSVar1 = local_28;
    ScriptContext::~ScriptContext(local_28);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,pSVar1,0x1470);
    (this->scriptContext).ptr = (ScriptContext *)0x0;
  }
  return;
}

Assistant:

void JavascriptLibraryBase::Dispose(bool isShutdown)
    {
        if (scriptContext)
        {
            HeapDelete(scriptContext);
            scriptContext = nullptr;
        }
    }